

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

string * QPDFCryptoProvider::getDefaultProvider_abi_cxx11_(void)

{
  __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  element_type *peVar1;
  string *in_RDI;
  
  this = (__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          *)getInstance();
  peVar1 = std::
           __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(this);
  std::__cxx11::string::string((string *)in_RDI,(string *)peVar1);
  return in_RDI;
}

Assistant:

std::string
QPDFCryptoProvider::getDefaultProvider()
{
    return getInstance().m->default_provider;
}